

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_thread_result ma_device_job_thread_entry(void *pUserData)

{
  anon_union_8_2_cf9b0fbd_for_toc local_88;
  ma_job job;
  ma_result result;
  ma_device_job_thread *pJobThread;
  void *pUserData_local;
  
  if (pUserData != (void *)0x0) {
    while ((job.data._76_4_ =
                 ma_device_job_thread_next
                           ((ma_device_job_thread *)pUserData,(ma_job *)&local_88.breakup),
           job.data._76_4_ == MA_SUCCESS && (local_88.breakup.code != 0))) {
      ma_job_process((ma_job *)&local_88.breakup);
    }
    return (ma_thread_result)0x0;
  }
  __assert_fail("pJobThread != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x6fa1,"ma_thread_result ma_device_job_thread_entry(void *)");
}

Assistant:

static ma_thread_result MA_THREADCALL ma_device_job_thread_entry(void* pUserData)
{
    ma_device_job_thread* pJobThread = (ma_device_job_thread*)pUserData;
    MA_ASSERT(pJobThread != NULL);

    for (;;) {
        ma_result result;
        ma_job job;

        result = ma_device_job_thread_next(pJobThread, &job);
        if (result != MA_SUCCESS) {
            break;
        }

        if (job.toc.breakup.code == MA_JOB_TYPE_QUIT) {
            break;
        }

        ma_job_process(&job);
    }

    return (ma_thread_result)0;
}